

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_pushboolean(lua_State *L,int b)

{
  StkId pTVar1;
  int iVar2;
  TValue *io;
  int b_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x25f,"void lua_pushboolean(lua_State *, int)");
  }
  pTVar1 = L->top;
  *(uint *)&pTVar1->value_ = (uint)(b != 0);
  pTVar1->tt_ = 1;
  L->top = L->top + 1;
  if (L->ci->top < L->top) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x261,"void lua_pushboolean(lua_State *, int)");
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x262,"void lua_pushboolean(lua_State *, int)");
  }
  return;
}

Assistant:

LUA_API void lua_pushboolean (lua_State *L, int b) {
  lua_lock(L);
  setbvalue(L->top, (b != 0));  /* ensure that true is 1 */
  api_incr_top(L);
  lua_unlock(L);
}